

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmTestGenerator.cxx
# Opt level: O1

void __thiscall
cmTestGenerator::GenerateScriptForConfig
          (cmTestGenerator *this,ostream *os,string *config,Indent indent)

{
  cmTest *pcVar1;
  cmMakefile *pcVar2;
  pointer pcVar3;
  long *plVar4;
  undefined8 uVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  cmake *cmakeInstance;
  cmListFileBacktrace *pcVar9;
  size_t sVar10;
  ostream *poVar11;
  cmGeneratorTarget *this_00;
  string *psVar12;
  Indent IVar13;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *arg;
  WrapQuotes wrapQuotes;
  undefined8 uVar14;
  pointer ppVar15;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar17;
  string_view str;
  string_view str_00;
  string_view str_01;
  anon_class_40_5_cf5cfc57 addLauncher;
  string equalSigns;
  string exe;
  cmList argv;
  cmGeneratorExpression ge;
  undefined1 local_168 [16];
  undefined1 local_158 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_140;
  undefined1 local_130 [32];
  char *local_110;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_108;
  string local_f0;
  string local_d0;
  undefined1 local_b0 [16];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_a0;
  cmListFileBacktrace local_90;
  long *local_80 [2];
  long local_70 [2];
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_60;
  cmGeneratorExpression local_48;
  
  this->TestGenerated = true;
  local_140._8_8_ = config;
  cmakeInstance = cmMakefile::GetCMakeInstance(this->Test->Makefile);
  local_140._M_allocated_capacity = (size_type)this;
  pcVar9 = cmTest::GetBacktrace(this->Test);
  local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (pcVar9->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr;
  local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi =
       (pcVar9->super_cmConstStack<cmListFileContext,_cmListFileBacktrace>).TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi;
  if (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
      UNLOCK();
    }
    else {
      (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
       super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
       ._M_refcount._M_pi)->_M_use_count =
           (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
            super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
            ._M_refcount._M_pi)->_M_use_count + 1;
    }
  }
  cmGeneratorExpression::cmGeneratorExpression(&local_48,cmakeInstance,&local_90);
  if (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_90.super_cmConstStack<cmListFileContext,_cmListFileBacktrace>.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  pcVar1 = *(cmTest **)(local_140._0_8_ + 0x78);
  pcVar2 = pcVar1->Makefile;
  local_168._0_8_ = local_158;
  pcVar3 = (pcVar1->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_168,pcVar3,pcVar3 + (pcVar1->Name)._M_string_length);
  bVar6 = anon_unknown.dwarf_64aaf0::needToQuoteTestName(pcVar2,(string *)local_168);
  if ((undefined1 *)local_168._0_8_ != local_158) {
    operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
  }
  local_168._0_8_ = local_158;
  pcVar3 = ((*(cmTest **)(local_140._0_8_ + 0x78))->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_168,pcVar3,
             pcVar3 + ((*(cmTest **)(local_140._0_8_ + 0x78))->Name)._M_string_length);
  sVar10 = anon_unknown.dwarf_64aaf0::countMaxConsecutiveEqualSigns((string *)local_168);
  local_110 = local_108._M_local_buf + 8;
  std::__cxx11::string::_M_construct((ulong)&local_110,(char)sVar10 + '\x01');
  if ((undefined1 *)local_168._0_8_ != local_158) {
    operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
  }
  if (bVar6) {
    IVar13.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar13.Level = IVar13.Level + -1;
      } while (IVar13.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_test([",10);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,local_110,local_108._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
    local_168._0_8_ = local_158;
    pcVar3 = ((*(cmTest **)(local_140._0_8_ + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,pcVar3,
               pcVar3 + ((*(cmTest **)(local_140._0_8_ + 0x78))->Name)._M_string_length);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_168._0_8_,local_168._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_110,local_108._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] ",2);
  }
  else {
    IVar13.Level = indent.Level;
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        IVar13.Level = IVar13.Level + -1;
      } while (IVar13.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"add_test(",9);
    local_168._0_8_ = local_158;
    pcVar3 = ((*(cmTest **)(local_140._0_8_ + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,pcVar3,
               pcVar3 + ((*(cmTest **)(local_140._0_8_ + 0x78))->Name)._M_string_length);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,(char *)local_168._0_8_,local_168._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
  }
  if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._0_8_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_158) {
    operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
  }
  uVar5 = local_140._0_8_;
  EvaluateCommandLineArguments
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_168,(cmTestGenerator *)local_140._0_8_,
             &(*(cmTest **)(local_140._0_8_ + 0x78))->Command,&local_48,(string *)local_140._8_8_);
  bVar7 = cmTest::GetCommandExpandLists(*(cmTest **)(uVar5 + 0x78));
  uVar14 = 1;
  cmList::
  cmList<std::move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>>
            ((cmList *)(local_b0 + 8),
             (move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )local_168._0_8_,
             (move_iterator<__gnu_cxx::__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              )local_168._8_8_,(uint)bVar7,Yes);
  uVar5 = local_168._0_8_;
  if (local_168._8_8_ != local_168._0_8_) {
    paVar16 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)(local_168._0_8_ + 0x10);
    do {
      plVar4 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (paVar16 + -1))->_M_dataplus)._M_p;
      if (paVar16 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar4) {
        operator_delete(plVar4,paVar16->_M_allocated_capacity + 1);
      }
      pbVar17 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(paVar16 + 1);
      paVar16 = paVar16 + 2;
    } while (pbVar17 !=
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_168._8_8_);
    local_168._8_8_ = uVar5;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_168);
  if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_b0._8_8_ == local_a0._M_pi) {
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::emplace_back<>((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)(local_b0 + 8));
  }
  local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
  pcVar3 = (((cmListFileContext *)local_b0._8_8_)->Name)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_d0,pcVar3,
             pcVar3 + (((cmListFileContext *)local_b0._8_8_)->Name)._M_string_length);
  this_00 = cmLocalGenerator::FindGeneratorTargetToUse
                      ((cmLocalGenerator *)
                       ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)(local_140._0_8_ + 0x70))->_M_allocated_capacity,&local_d0);
  if ((this_00 == (cmGeneratorTarget *)0x0) ||
     (TVar8 = cmGeneratorTarget::GetType(this_00), TVar8 != EXECUTABLE)) {
    cmsys::SystemTools::ConvertToUnixSlashes(&local_d0);
  }
  else {
    uVar14 = 0;
    cmGeneratorTarget::GetFullPath
              ((string *)local_168,this_00,(string *)local_140._8_8_,RuntimeBinaryArtifact,false);
    std::__cxx11::string::operator=((string *)&local_d0,(string *)local_168);
    if ((cmTestGenerator *)local_168._0_8_ != (cmTestGenerator *)local_158) {
      operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
    }
    local_168._0_8_ = local_140._0_8_;
    local_168._8_8_ = local_140._8_8_;
    paVar16 = &local_f0.field_2;
    local_158._0_8_ = &local_48;
    local_158._8_8_ = os;
    local_158._16_8_ = this_00;
    local_f0._M_dataplus._M_p = (pointer)paVar16;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"TEST_LAUNCHER","");
    GenerateScriptForConfig::anon_class_40_5_cf5cfc57::operator()
              ((anon_class_40_5_cf5cfc57 *)local_168,&local_f0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f0._M_dataplus._M_p != paVar16) {
      operator_delete(local_f0._M_dataplus._M_p,(ulong)(local_f0.field_2._M_allocated_capacity + 1))
      ;
    }
    bVar7 = true;
    if ((*(cmTest **)(local_140._0_8_ + 0x78))->PolicyStatusCMP0158 == NEW) {
      pcVar2 = *(cmMakefile **)
                (((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)(local_140._0_8_ + 0x70))->_M_allocated_capacity + 0x70);
      local_f0._M_dataplus._M_p = (pointer)paVar16;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_f0,"CMAKE_CROSSCOMPILING","")
      ;
      bVar7 = cmMakefile::IsOn(pcVar2,&local_f0);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_f0._M_dataplus._M_p != paVar16) {
        operator_delete(local_f0._M_dataplus._M_p,
                        (ulong)(local_f0.field_2._M_allocated_capacity + 1));
      }
    }
    if (bVar7 != false) {
      local_130._0_8_ = (pointer)(local_130 + 0x10);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_130,"CROSSCOMPILING_EMULATOR","");
      GenerateScriptForConfig::anon_class_40_5_cf5cfc57::operator()
                ((anon_class_40_5_cf5cfc57 *)local_168,(string *)local_130);
      if ((pointer)local_130._0_8_ != (pointer)(local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
      }
    }
  }
  str._M_str = (char *)0x0;
  str._M_len = (size_t)local_d0._M_dataplus._M_p;
  cmOutputConverter::EscapeForCMake_abi_cxx11_
            ((string *)local_168,(cmOutputConverter *)local_d0._M_string_length,str,
             (WrapQuotes)uVar14);
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_168._0_8_,local_168._8_8_);
  if ((cmTestGenerator *)local_168._0_8_ != (cmTestGenerator *)local_158) {
    operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
  }
  psVar12 = &((cmListFileContext *)local_b0._8_8_)->FilePath;
  if (psVar12 != (string *)local_a0._M_pi) {
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      str_00._M_str = (char *)0x0;
      str_00._M_len = (size_t)(psVar12->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)local_168,(cmOutputConverter *)psVar12->_M_string_length,str_00,
                 (WrapQuotes)uVar14);
      std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_168._0_8_,local_168._8_8_)
      ;
      if ((cmTestGenerator *)local_168._0_8_ != (cmTestGenerator *)local_158) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
      }
      psVar12 = psVar12 + 1;
    } while (psVar12 != (string *)local_a0._M_pi);
  }
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  if (bVar6) {
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties([",0x16);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,local_110,local_108._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"[",1);
    local_168._0_8_ = local_158;
    pcVar3 = ((*(cmTest **)(local_140._0_8_ + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,pcVar3,
               pcVar3 + ((*(cmTest **)(local_140._0_8_ + 0x78))->Name)._M_string_length);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,(char *)local_168._0_8_,local_168._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"]",1);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (poVar11,local_110,local_108._M_allocated_capacity);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11,"] PROPERTIES ",0xd);
  }
  else {
    if (0 < indent.Level) {
      do {
        std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
        indent.Level = indent.Level + -1;
      } while (indent.Level != 0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(os,"set_tests_properties(",0x15);
    local_168._0_8_ = local_158;
    pcVar3 = ((*(cmTest **)(local_140._0_8_ + 0x78))->Name)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_168,pcVar3,
               pcVar3 + ((*(cmTest **)(local_140._0_8_ + 0x78))->Name)._M_string_length);
    poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                        (os,(char *)local_168._0_8_,local_168._8_8_);
    std::__ostream_insert<char,std::char_traits<char>>(poVar11," PROPERTIES ",0xc);
  }
  if ((undefined1 *)local_168._0_8_ != local_158) {
    operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
  }
  cmPropertyMap::GetList_abi_cxx11_(&local_60,&(*(cmTest **)(local_140._0_8_ + 0x78))->Properties);
  if (local_60.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_60.
      super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    ppVar15 = local_60.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    do {
      std::__ostream_insert<char,std::char_traits<char>>(os," ",1);
      poVar11 = std::__ostream_insert<char,std::char_traits<char>>
                          (os,(ppVar15->first)._M_dataplus._M_p,(ppVar15->first)._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>(poVar11," ",1);
      local_80[0] = local_70;
      pcVar3 = (ppVar15->second)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_80,pcVar3,pcVar3 + (ppVar15->second)._M_string_length);
      cmGeneratorExpression::Parse((cmGeneratorExpression *)local_b0,(string *)&local_48);
      local_130._0_8_ = local_130 + 0x10;
      local_130._8_8_ = (pointer)0x0;
      local_130[0x10] = '\0';
      wrapQuotes = Wrap;
      psVar12 = cmCompiledGeneratorExpression::Evaluate
                          ((cmCompiledGeneratorExpression *)local_b0._0_8_,
                           (cmLocalGenerator *)
                           ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)(local_140._0_8_ + 0x70))->_M_allocated_capacity,
                           (string *)local_140._8_8_,(cmGeneratorTarget *)0x0,
                           (cmGeneratorExpressionDAGChecker *)0x0,(cmGeneratorTarget *)0x0,
                           (string *)local_130);
      str_01._M_str = (char *)0x0;
      str_01._M_len = (size_t)(psVar12->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)local_168,(cmOutputConverter *)psVar12->_M_string_length,str_01,
                 wrapQuotes);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar11,(char *)local_168._0_8_,local_168._8_8_);
      if ((undefined1 *)local_168._0_8_ != local_158) {
        operator_delete((void *)local_168._0_8_,(ulong)(local_158._0_8_ + 1));
      }
      if ((pointer)local_130._0_8_ != (pointer)(local_130 + 0x10)) {
        operator_delete((void *)local_130._0_8_,CONCAT71(local_130._17_7_,local_130[0x10]) + 1);
      }
      std::
      unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
      ::~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
                     *)local_b0);
      if (local_80[0] != local_70) {
        operator_delete(local_80[0],local_70[0] + 1);
      }
      ppVar15 = ppVar15 + 1;
    } while (ppVar15 !=
             local_60.
             super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish);
  }
  std::
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_60);
  GenerateInternalProperties((cmTestGenerator *)local_140._0_8_,os);
  std::__ostream_insert<char,std::char_traits<char>>(os,")\n",2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != &local_d0.field_2) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_b0 + 8));
  if (local_110 != local_108._M_local_buf + 8) {
    operator_delete(local_110,local_108._8_8_ + 1);
  }
  cmGeneratorExpression::~cmGeneratorExpression(&local_48);
  return;
}

Assistant:

void cmTestGenerator::GenerateScriptForConfig(std::ostream& os,
                                              const std::string& config,
                                              Indent indent)
{
  this->TestGenerated = true;

  // Set up generator expression evaluation context.
  cmGeneratorExpression ge(*this->Test->GetMakefile()->GetCMakeInstance(),
                           this->Test->GetBacktrace());

  // Determine if policy CMP0110 is set to NEW.
  const bool quote_test_name =
    needToQuoteTestName(*this->Test->GetMakefile(), this->Test->GetName());
  // Determine the number of equal-signs needed for quoting test name with
  // [==[...]==] syntax.
  const std::string equalSigns(
    1 + countMaxConsecutiveEqualSigns(this->Test->GetName()), '=');

  // Start the test command.
  if (quote_test_name) {
    os << indent << "add_test([" << equalSigns << "[" << this->Test->GetName()
       << "]" << equalSigns << "] ";
  } else {
    os << indent << "add_test(" << this->Test->GetName() << " ";
  }

  // Evaluate command line arguments
  cmList argv{
    this->EvaluateCommandLineArguments(this->Test->GetCommand(), ge, config),
    // Expand arguments if COMMAND_EXPAND_LISTS is set
    this->Test->GetCommandExpandLists() ? cmList::ExpandElements::Yes
                                        : cmList::ExpandElements::No,
    cmList::EmptyElements::Yes
  };
  // Expanding lists on an empty command may have left it empty
  if (argv.empty()) {
    argv.emplace_back();
  }

  // Check whether the command executable is a target whose name is to
  // be translated.
  std::string exe = argv[0];
  cmGeneratorTarget* target = this->LG->FindGeneratorTargetToUse(exe);
  if (target && target->GetType() == cmStateEnums::EXECUTABLE) {
    // Use the target file on disk.
    exe = target->GetFullPath(config);

    auto addLauncher = [this, &config, &ge, &os,
                        target](std::string const& propertyName) {
      cmValue launcher = target->GetProperty(propertyName);
      if (!cmNonempty(launcher)) {
        return;
      }
      cmList launcherWithArgs{ ge.Parse(*launcher)->Evaluate(this->LG,
                                                             config) };
      if (!launcherWithArgs.empty() && !launcherWithArgs[0].empty()) {
        std::string launcherExe(launcherWithArgs[0]);
        cmSystemTools::ConvertToUnixSlashes(launcherExe);
        os << cmOutputConverter::EscapeForCMake(launcherExe) << " ";
        for (std::string const& arg :
             cmMakeRange(launcherWithArgs).advance(1)) {
          os << cmOutputConverter::EscapeForCMake(arg) << " ";
        }
      }
    };

    // Prepend with the test launcher if specified.
    addLauncher("TEST_LAUNCHER");

    // Prepend with the emulator when cross compiling if required.
    if (!this->GetTest()->GetCMP0158IsNew() ||
        this->LG->GetMakefile()->IsOn("CMAKE_CROSSCOMPILING")) {
      addLauncher("CROSSCOMPILING_EMULATOR");
    }
  } else {
    // Use the command name given.
    cmSystemTools::ConvertToUnixSlashes(exe);
  }

  // Generate the command line with full escapes.
  os << cmOutputConverter::EscapeForCMake(exe);

  for (auto const& arg : cmMakeRange(argv).advance(1)) {
    os << " " << cmOutputConverter::EscapeForCMake(arg);
  }

  // Finish the test command.
  os << ")\n";

  // Output properties for the test.
  if (quote_test_name) {
    os << indent << "set_tests_properties([" << equalSigns << "["
       << this->Test->GetName() << "]" << equalSigns << "] PROPERTIES ";
  } else {
    os << indent << "set_tests_properties(" << this->Test->GetName()
       << " PROPERTIES ";
  }
  for (auto const& i : this->Test->GetProperties().GetList()) {
    os << " " << i.first << " "
       << cmOutputConverter::EscapeForCMake(
            ge.Parse(i.second)->Evaluate(this->LG, config));
  }
  this->GenerateInternalProperties(os);
  os << ")\n";
}